

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbj.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  int i;
  int iVar4;
  uint uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  BandStop bs;
  LowPass f;
  undefined1 local_e8 [16];
  RBJbase local_c8;
  RBJbase local_78;
  
  local_78.super_Biquad.m_a0 = 1.0;
  local_78.super_Biquad.m_a1 = 0.0;
  local_78.super_Biquad.m_a2 = 0.0;
  local_78.super_Biquad.m_b1 = 0.0;
  local_78.super_Biquad.m_b2 = 0.0;
  local_78.super_Biquad.m_b0 = 1.0;
  local_78.state.m_x2 = 0.0;
  local_78.state.m_y2 = 0.0;
  local_78.state.m_x1 = 0.0;
  local_78.state.m_y1 = 0.0;
  Iir::RBJ::LowPass::setupN((LowPass *)&local_78,0.005,1.0);
  iVar4 = 10000;
  while (iVar4 != 0) {
    uVar5 = 0x3ff00000;
    if (iVar4 != 0x2706) {
      uVar5 = 0;
    }
    dVar1 = Iir::RBJ::RBJbase::filter<double>(&local_78,(double)((ulong)uVar5 << 0x20));
    local_e8._8_4_ = extraout_XMM0_Dc;
    local_e8._0_8_ = dVar1;
    local_e8._12_4_ = extraout_XMM0_Dd;
    assert_print((uint)(!NAN(dVar1) && !NAN(dVar1)),"Lowpass output is NAN\n");
    iVar4 = iVar4 + -1;
  }
  fprintf(_stderr,"%e\n",local_e8._0_4_);
  assert_print((uint)(ABS((double)local_e8._0_8_) < 1e-15),"Lowpass value for t->inf to high!");
  local_c8.super_Biquad.m_a0 = 1.0;
  local_c8.super_Biquad.m_a1 = 0.0;
  local_c8.super_Biquad.m_a2 = 0.0;
  local_c8.super_Biquad.m_b1 = 0.0;
  local_c8.super_Biquad.m_b2 = 0.0;
  local_c8.super_Biquad.m_b0 = 1.0;
  local_c8.state.m_x2 = 0.0;
  local_c8.state.m_y2 = 0.0;
  local_c8.state.m_x1 = 0.0;
  local_c8.state.m_y1 = 0.0;
  Iir::RBJ::BandStop::setupN((BandStop *)&local_c8,0.05,0.005);
  iVar4 = 100000;
  while (iVar4 != 0) {
    uVar5 = 0x3ff00000;
    if (iVar4 != 0x18696) {
      uVar5 = 0;
    }
    dVar1 = Iir::RBJ::RBJbase::filter<double>(&local_c8,(double)((ulong)uVar5 << 0x20));
    local_e8._8_4_ = extraout_XMM0_Dc_00;
    local_e8._0_8_ = dVar1;
    local_e8._12_4_ = extraout_XMM0_Dd_00;
    assert_print((uint)(!NAN(dVar1) && !NAN(dVar1)),"Bandstop output is NAN\n");
    iVar4 = iVar4 + -1;
  }
  fprintf(_stderr,"%e\n",local_e8._0_4_);
  assert_print((uint)(ABS((double)local_e8._0_8_) < 1e-15),"Bandstop value for t->inf to high!");
  dVar1 = 0.0;
  for (uVar5 = 0; uVar5 != 100000; uVar5 = uVar5 + 1) {
    dVar2 = sin(dVar1 * 0.3141592653589793);
    dVar2 = Iir::RBJ::RBJbase::filter<double>(&local_c8,dVar2);
    uVar3 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01) & 0x7fffffffffffffff;
    local_e8._8_4_ = (int)uVar3;
    local_e8._0_8_ = ABS(dVar2);
    local_e8._12_4_ = (int)(uVar3 >> 0x20);
    if (50000 < uVar5) {
      assert_print((uint)(ABS(dVar2) < 1e-05),"Bandstop not removing sine.");
    }
    dVar1 = dVar1 + 1.0;
  }
  fprintf(_stderr,"%e\n",local_e8._0_4_);
  return 0;
}

Assistant:

int main(int, char**)
{
	Iir::RBJ::LowPass f;
	const double samplingrate = 1000; // Hz
	const double cutoff_frequency = 5; // Hz
	const double qfactor = 1;
	f.setup(samplingrate, cutoff_frequency, qfactor);
	double b;
	for (int i = 0; i < 10000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		b = f.filter(a);
		//fprintf(stdout,"%e\n",b);
		assert_print(!isnan(b), "Lowpass output is NAN\n");
	}
	fprintf(stderr, "%e\n", b);
	assert_print(fabs(b) < 1E-15, "Lowpass value for t->inf to high!");

	Iir::RBJ::BandStop bs;
	const double center_frequency = 0.05;
	const double frequency_width = 0.005;
	bs.setupN(center_frequency, frequency_width);
	for (int i = 0; i < 100000; i++)
	{
		double a = 0;
		if (i == 10) a = 1;
		b = bs.filter(a);
		assert_print(!isnan(b), "Bandstop output is NAN\n");
	}
	fprintf(stderr, "%e\n", b);
	assert_print(fabs(b) < 1E-15, "Bandstop value for t->inf to high!");

	for (int i = 0; i < 100000; i++)
	{
		b = fabs(bs.filter(sin(2 * M_PI*center_frequency*i)));
		if (i > 50000) {
			assert_print(b < 1E-5, "Bandstop not removing sine.");
		}
	}
	fprintf(stderr, "%e\n", b);
	return 0;
}